

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O0

bool __thiscall google::protobuf::Descriptor::IsReservedName(Descriptor *this,string *name)

{
  __type _Var1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int i;
  int local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  local_1c = 0;
  __lhs = in_RDI;
  while( true ) {
    iVar2 = reserved_name_count((Descriptor *)in_RDI);
    if (iVar2 <= local_1c) {
      return false;
    }
    reserved_name_abi_cxx11_((Descriptor *)in_RDI,local_1c);
    _Var1 = std::operator==(__lhs,in_RSI);
    if (_Var1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

inline bool Descriptor::IsReservedName(const std::string& name) const {
  for (int i = 0; i < reserved_name_count(); i++) {
    if (name == reserved_name(i)) {
      return true;
    }
  }
  return false;
}